

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

cmMakefileTargetGenerator * cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)

{
  TargetType TVar1;
  cmMakefileLibraryTargetGenerator *this;
  
  TVar1 = cmGeneratorTarget::GetType(tgt);
  if (TVar1 - STATIC_LIBRARY < 4) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x438);
    cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(this,tgt);
  }
  else if (TVar1 == UTILITY) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x418);
    cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
              ((cmMakefileUtilityTargetGenerator *)this,tgt);
  }
  else if (TVar1 == EXECUTABLE) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x418);
    cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
              ((cmMakefileExecutableTargetGenerator *)this,tgt);
  }
  else {
    this = (cmMakefileLibraryTargetGenerator *)0x0;
  }
  return &this->super_cmMakefileTargetGenerator;
}

Assistant:

cmMakefileTargetGenerator *
cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)
{
  cmMakefileTargetGenerator *result = 0;

  switch (tgt->GetType())
    {
    case cmState::EXECUTABLE:
      result = new cmMakefileExecutableTargetGenerator(tgt);
      break;
    case cmState::STATIC_LIBRARY:
    case cmState::SHARED_LIBRARY:
    case cmState::MODULE_LIBRARY:
    case cmState::OBJECT_LIBRARY:
      result = new cmMakefileLibraryTargetGenerator(tgt);
      break;
    case cmState::UTILITY:
      result = new cmMakefileUtilityTargetGenerator(tgt);
      break;
    default:
      return result;
      // break; /* unreachable */
    }
  return result;
}